

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

char * kwssys::SystemTools::ReplaceChars(char *str,char *toreplace,char replacement)

{
  char *ptr2;
  char *ptr;
  char replacement_local;
  char *toreplace_local;
  char *str_local;
  
  ptr = str;
  if (str != (char *)0x0) {
    for (; ptr2 = toreplace, *ptr != '\0'; ptr = ptr + 1) {
      for (; *ptr2 != '\0'; ptr2 = ptr2 + 1) {
        if (*ptr == *ptr2) {
          *ptr = replacement;
        }
      }
    }
  }
  return str;
}

Assistant:

char* SystemTools::ReplaceChars(char* str, const char* toreplace,
                                char replacement)
{
  if (str) {
    char* ptr = str;
    while (*ptr) {
      const char* ptr2 = toreplace;
      while (*ptr2) {
        if (*ptr == *ptr2) {
          *ptr = replacement;
        }
        ++ptr2;
      }
      ++ptr;
    }
  }
  return str;
}